

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>
::CopyNamesFromValueNodes
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>
           *this)

{
  long __n;
  reference this_00;
  long lVar1;
  string local_50 [32];
  
  __n = ((long)(this->super_BasicConstraintKeeper).value_node_.vStr_.
               super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(this->super_BasicConstraintKeeper).value_node_.vStr_.
              super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x28;
  lVar1 = __n * 0x28;
  while( true ) {
    __n = __n + -1;
    if (__n == -1) break;
    this_00 = std::
              _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container_*>
              ::operator[](&(this->cons_).
                            super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>_>::Container>_>
                            ._M_impl.super__Deque_impl_data._M_start,__n);
    std::__cxx11::string::string
              (local_50,(string *)
                        ((long)&(this->super_BasicConstraintKeeper).value_node_.vStr_.
                                super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].s_._M_dataplus._M_p +
                        lVar1));
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_50);
    lVar1 = lVar1 + -0x28;
  }
  return;
}

Assistant:

void CopyNamesFromValueNodes() override {
    const auto& vn = GetValueNode().GetStrVec();
    assert(vn.size()==cons_.size());
    for (auto i=vn.size(); i--; )
      cons_[i].GetCon().SetName(vn[i].MakeCurrentName());
  }